

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main-moduled-decompress.c
# Opt level: O0

int main(int argc,char **argv)

{
  FILE *__stream;
  bool bVar1;
  char *local_60;
  undefined1 local_58 [8];
  KosinskiDecompressCallbacks callbacks;
  FILE *out_file;
  char *out_filename;
  FILE *in_file;
  int exit_code;
  char **argv_local;
  int argc_local;
  
  in_file._4_4_ = 0;
  if (argc < 2) {
    fputs("This tool decompresses a supplied file that\'s in the Moduled Kosinski format.\n\nwww.github.com/Clownacy/accurate-kosinski\n\nUsage: kosinskim-decompress [in_file] [out_file](optional)\n"
          ,_stdout);
  }
  else {
    __stream = fopen(argv[1],"rb");
    if (__stream == (FILE *)0x0) {
      in_file._4_4_ = 1;
      fprintf(_stderr,"Could not open \'%s\'\n",argv[1]);
    }
    else {
      if (argc < 3) {
        local_60 = "out.unc";
      }
      else {
        local_60 = argv[2];
      }
      callbacks.write_byte = (_func_void_void_ptr_uint *)fopen(local_60,"wb");
      bVar1 = (FILE *)callbacks.write_byte != (FILE *)0x0;
      if (bVar1) {
        callbacks.read_byte_user_data = ReadByte;
        callbacks.write_byte_user_data = WriteByte;
        local_58 = (undefined1  [8])__stream;
        callbacks.read_byte = (_func_uint_void_ptr *)callbacks.write_byte;
        KosinskiDecompressModuled((KosinskiDecompressCallbacks *)local_58,'\0');
        fclose((FILE *)callbacks.write_byte);
      }
      else {
        fprintf(_stderr,"Could not open \'%s\'\n",local_60);
      }
      in_file._4_4_ = (uint)!bVar1;
      fclose(__stream);
    }
  }
  return in_file._4_4_;
}

Assistant:

int main(const int argc, char** const argv)
{
	int exit_code = EXIT_SUCCESS;

	if (argc < 2)
	{
		fputs(
			"This tool decompresses a supplied file that's in the Moduled Kosinski format.\n"
			"\n"
			"www.github.com/Clownacy/accurate-kosinski\n"
			"\n"
			"Usage: kosinskim-decompress [in_file] [out_file](optional)\n"
			, stdout
		);
	}
	else
	{
		FILE* const in_file = fopen(argv[1], "rb");

		if (in_file == NULL)
		{
			exit_code = EXIT_FAILURE;
			fprintf(stderr, "Could not open '%s'\n", argv[1]);
		}
		else
		{
			const char* const out_filename = (argc > 2) ? argv[2] : "out.unc";
			FILE* const out_file = fopen(out_filename, "wb");

			if (out_file == NULL)
			{
				exit_code = EXIT_FAILURE;
				fprintf(stderr, "Could not open '%s'\n", out_filename);
			}
			else
			{
				KosinskiDecompressCallbacks callbacks;
				callbacks.read_byte_user_data = in_file;
				callbacks.read_byte = ReadByte;
				callbacks.write_byte_user_data = out_file;
				callbacks.write_byte = WriteByte;

				KosinskiDecompressModuled(&callbacks,
				#ifdef DEBUG
					cc_true
				#else
					cc_false
				#endif
				);

				fclose(out_file);
			}

			fclose(in_file);
		}
	}

	return exit_code;
}